

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu1.c
# Opt level: O3

MPP_RET hal_jpegd_vdpu1_init(void *hal,MppHalCfg *cfg)

{
  undefined8 uVar1;
  undefined8 uVar2;
  MPP_RET MVar3;
  undefined8 in_RAX;
  void *__s;
  char *fmt;
  MppBufferGroup group;
  undefined1 auVar4 [16];
  
  if ((hal == (void *)0x0) &&
     (_mpp_log_l(2,"HAL_JPEGD_VDPU1","Assertion %s failed at %s:%d\n",(char *)0x0,"JpegHalCtx",
                 "hal_jpegd_vdpu1_init",CONCAT44((int)((ulong)in_RAX >> 0x20),0x2e0)),
     (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","enter\n","hal_jpegd_vdpu1_init");
  }
  *(MppCbCtx **)((long)hal + 0x88) = cfg->dec_cb;
  uVar1 = cfg->frame_slots;
  uVar2 = cfg->packet_slots;
  auVar4._8_4_ = (int)uVar1;
  auVar4._0_8_ = uVar2;
  auVar4._12_4_ = (int)((ulong)uVar1 >> 0x20);
  *(undefined1 (*) [16])hal = auVar4;
  *(uint *)((long)hal + 0xb0) = *(uint *)&cfg->hw_info->field_0x4 >> 0x11 & 1;
  __s = *(void **)((long)hal + 0x18);
  if (__s == (void *)0x0) {
    __s = mpp_osal_calloc("hal_jpegd_vdpu1_init",0x318);
    *(void **)((long)hal + 0x18) = __s;
    if (__s != (void *)0x0) goto LAB_0020e8e1;
    _mpp_log_l(2,"HAL_JPEGD_VDPU1","hal jpegd reg alloc failed\n",(char *)0x0);
    MVar3 = MPP_ERR_NOMEM;
    if (((byte)jpegd_debug & 1) == 0) {
      return MPP_ERR_NOMEM;
    }
LAB_0020ea02:
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","exit\n","hal_jpegd_vdpu1_init");
  }
  else {
LAB_0020e8e1:
    memset(__s,0,0x318);
    group = *(MppBufferGroup *)((long)hal + 0x20);
    if (group == (MppBufferGroup)0x0) {
      MVar3 = mpp_buffer_group_get
                        ((MppBufferGroup *)((long)hal + 0x20),MPP_BUFFER_TYPE_ION,
                         MPP_BUFFER_INTERNAL,"HAL_JPEGD_VDPU1","hal_jpegd_vdpu1_init");
      if (MVar3 == MPP_OK) {
        group = *(MppBufferGroup *)((long)hal + 0x20);
        goto LAB_0020e8f6;
      }
      fmt = "mpp_buffer_group_get failed ret %d\n";
    }
    else {
LAB_0020e8f6:
      MVar3 = mpp_buffer_get_with_tag
                        (group,(MppBuffer *)((long)hal + 0x28),0x220,"HAL_JPEGD_VDPU1",
                         "hal_jpegd_vdpu1_init");
      if (MVar3 == MPP_OK) {
        *(undefined1 (*) [16])((long)hal + 0xb4) = (undefined1  [16])0x0;
        *(undefined4 *)((long)hal + 0xc4) = 0;
        *(undefined2 *)((long)hal + 0xb5) = 0x501;
        *(undefined1 (*) [16])((long)hal + 0x90) = (undefined1  [16])0x0;
        *(undefined4 *)((long)hal + 0xa0) = 0;
        if (((byte)jpegd_debug & 1) == 0) {
          return MPP_OK;
        }
        MVar3 = MPP_OK;
        goto LAB_0020ea02;
      }
      fmt = "get table buffer failed ret %d\n";
    }
    _mpp_log_l(2,"HAL_JPEGD_VDPU1",fmt,"hal_jpegd_vdpu1_init",(ulong)(uint)MVar3);
  }
  return MVar3;
}

Assistant:

MPP_RET hal_jpegd_vdpu1_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;

    mpp_assert(JpegHalCtx);
    jpegd_dbg_func("enter\n");

    //configure
    JpegHalCtx->dec_cb       = cfg->dec_cb;
    JpegHalCtx->packet_slots = cfg->packet_slots;
    JpegHalCtx->frame_slots  = cfg->frame_slots;
    JpegHalCtx->have_pp      = cfg->hw_info->cap_jpg_pp_out;

    /* allocate regs buffer */
    if (JpegHalCtx->regs == NULL) {
        JpegHalCtx->regs = mpp_calloc_size(void, sizeof(JpegdIocRegInfo));
        if (JpegHalCtx->regs == NULL) {
            mpp_err("hal jpegd reg alloc failed\n");

            jpegd_dbg_func("exit\n");
            return MPP_ERR_NOMEM;
        }
    }
    JpegdIocRegInfo *info = (JpegdIocRegInfo *)JpegHalCtx->regs;
    memset(info, 0, sizeof(JpegdIocRegInfo));

    //malloc hw buf
    if (JpegHalCtx->group == NULL) {
        ret = mpp_buffer_group_get_internal(&JpegHalCtx->group,
                                            MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err_f("mpp_buffer_group_get failed ret %d\n", ret);
            return ret;
        }
    }

    ret = mpp_buffer_get(JpegHalCtx->group, &JpegHalCtx->pTableBase,
                         JPEGD_BASELINE_TABLE_SIZE);
    if (ret) {
        mpp_err_f("get table buffer failed ret %d\n", ret);
        return ret;
    }

    PPInfo *pp_info = &(JpegHalCtx->pp_info);
    memset(pp_info, 0, sizeof(PPInfo));
    pp_info->pp_enable = 0;
    pp_info->pp_in_fmt = PP_IN_FORMAT_YUV420SEMI;
    pp_info->pp_out_fmt = PP_OUT_FORMAT_YUV420INTERLAVE;

    JpegHalCtx->output_fmt = MPP_FMT_YUV420SP;
    JpegHalCtx->set_output_fmt_flag = 0;

    /* init dbg stuff */
    JpegHalCtx->hal_debug_enable = 0;
    JpegHalCtx->frame_count = 0;
    JpegHalCtx->output_yuv_count = 0;

    jpegd_dbg_func("exit\n");
    return MPP_OK;
}